

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.hpp
# Opt level: O0

void __thiscall duckdb::SecretManager::SecretManager(SecretManager *this)

{
  undefined8 *in_RDI;
  SecretManagerConfig *in_stack_00000010;
  undefined1 __i;
  atomic<bool> *this_00;
  
  *in_RDI = &PTR__SecretManager_0350a868;
  ::std::mutex::mutex((mutex *)0x9685ca);
  __i = (undefined1)((ulong)(in_RDI + 6) >> 0x38);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunctionSet,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunctionSet>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunctionSet,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunctionSet>_>_>
                   *)0x9685dc);
  this_00 = (atomic<bool> *)(in_RDI + 0xd);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>_>_>
                   *)0x9685ef);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>_>_>_>
                   *)0x968605);
  ::std::atomic<bool>::atomic(this_00,(bool)__i);
  SecretManagerConfig::SecretManagerConfig(in_stack_00000010);
  optional_ptr<duckdb::DatabaseInstance,_true>::optional_ptr
            ((optional_ptr<duckdb::DatabaseInstance,_true> *)(in_RDI + 0x2a));
  return;
}

Assistant:

explicit SecretManager() = default;